

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int do_makedir(char *path)

{
  __mode_t __mask;
  uint __mode;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  __mode_t local_dc;
  char *local_c8;
  char *slash;
  mode_t oumask;
  mode_t f_mode;
  mode_t dir_mode;
  int ishere;
  int finished;
  stat sb;
  char *path_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)path;
  sb.__glibc_reserved[2] = (__syscall_slong_t)adjustname(path,1);
  if ((char *)sb.__glibc_reserved[2] == (char *)0x0) {
    path_local._4_4_ = 0;
  }
  else {
    local_c8 = strrchr((char *)sb.__glibc_reserved[2],0);
    while( true ) {
      local_c8 = local_c8 + -1;
      bVar4 = false;
      if ((ulong)sb.__glibc_reserved[2] < local_c8) {
        bVar4 = *local_c8 == '/';
      }
      if (!bVar4) break;
      *local_c8 = '\0';
    }
    local_c8 = (char *)sb.__glibc_reserved[2];
    __mask = umask(0);
    __mode = (__mask ^ 0xffffffff) & 0x1ff;
    while( true ) {
      while( true ) {
        sVar2 = strspn(local_c8,"/");
        sVar3 = strcspn(local_c8 + sVar2,"/");
        local_c8 = local_c8 + sVar2 + sVar3;
        bVar4 = *local_c8 == '\0';
        *local_c8 = '\0';
        iVar1 = stat((char *)sb.__glibc_reserved[2],(stat *)&ishere);
        bVar5 = iVar1 == 0;
        if ((bVar4) && (bVar5)) {
          dobeep();
          ewprintf("Cannot create directory %s: file exists",sb.__glibc_reserved[2]);
          return 0;
        }
        if (((bVar4) || (!bVar5)) || (((uint)sb.st_nlink & 0xf000) != 0x4000)) break;
        *local_c8 = '/';
      }
      local_dc = __mode | 0xc0;
      if (bVar4) {
        local_dc = __mode;
      }
      iVar1 = mkdir((char *)sb.__glibc_reserved[2],local_dc);
      if (iVar1 == 0) {
        if ((0x1ff < __mode) && (iVar1 = chmod((char *)sb.__glibc_reserved[2],__mode), iVar1 == -1))
        {
          umask(__mask);
          return 2;
        }
      }
      else if ((!bVar5) || (((uint)sb.st_nlink & 0xf000) != 0x4000)) {
        if (bVar5) {
          eerase();
        }
        else {
          dobeep();
          ewprintf("Creating directory: permission denied, %s",sb.__glibc_reserved[2]);
        }
        umask(__mask);
        return 0;
      }
      if (bVar4) break;
      *local_c8 = '/';
    }
    eerase();
    umask(__mask);
    path_local._4_4_ = 1;
  }
  return path_local._4_4_;
}

Assistant:

int
do_makedir(char *path)
{
	struct stat	 sb;
	int		 finished, ishere;
	mode_t		 dir_mode, f_mode, oumask;
	char		*slash;

	if ((path = adjustname(path, TRUE)) == NULL)
		return (FALSE);

	/* Remove trailing slashes */
	slash = strrchr(path, '\0');
	while (--slash > path && *slash == '/')
		*slash = '\0';

	slash = path;

	oumask = umask(0);
	f_mode = 0777 & ~oumask;
	dir_mode = f_mode | S_IWUSR | S_IXUSR;

	for (;;) {
		slash += strspn(slash, "/");
		slash += strcspn(slash, "/");

		finished = (*slash == '\0');
		*slash = '\0';

		ishere = !stat(path, &sb);
		if (finished && ishere) {
			dobeep();
			ewprintf("Cannot create directory %s: file exists",
			     path);
			return(FALSE);
		} else if (!finished && ishere && S_ISDIR(sb.st_mode)) {
			*slash = '/';
			continue;
		}

		if (mkdir(path, finished ? f_mode : dir_mode) == 0) {
			if (f_mode > 0777 && chmod(path, f_mode) == -1) {
				umask(oumask);
				return (ABORT);
			}
		} else {
			if (!ishere || !S_ISDIR(sb.st_mode)) {
				if (!ishere) {
					dobeep();
					ewprintf("Creating directory: "
					    "permission denied, %s", path);
				} else
					eerase();

				umask(oumask);
				return (FALSE);
			}
		}

		if (finished)
			break;

		*slash = '/';
	}

	eerase();
	umask(oumask);
	return (TRUE);
}